

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O1

void vkt::BindingModel::anon_unknown_1::ImageFetchRenderInstance::writeDescriptorSet
               (DeviceInterface *vki,VkDevice device,VkDescriptorType descriptorType,
               ShaderInputInterface shaderInterface,VkDescriptorSetLayout layout,
               VkDescriptorPool pool,VkImageView viewA,VkImageView viewB,
               VkDescriptorSet descriptorSet,DescriptorSetUpdateBuilder *updateBuilder,
               DescriptorUpdateMethod updateMethod)

{
  undefined1 *__buf;
  
  if (shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY) {
    __buf = (undefined1 *)0x0;
  }
  else if (shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
    ::vk::DescriptorSetUpdateBuilder::write
              ((DescriptorSetUpdateBuilder *)viewB.m_internal,(int)viewA.m_internal,(void *)0x0,0);
    __buf = &DAT_00000001;
  }
  else {
    if (shaderInterface != SHADER_INPUT_SINGLE_DESCRIPTOR) goto LAB_00550616;
    __buf = (undefined1 *)0x0;
  }
  ::vk::DescriptorSetUpdateBuilder::write
            ((DescriptorSetUpdateBuilder *)viewB.m_internal,(int)viewA.m_internal,__buf,0);
LAB_00550616:
  if ((int)descriptorSet.m_internal == 0) {
    ::vk::DescriptorSetUpdateBuilder::update
              ((DescriptorSetUpdateBuilder *)viewB.m_internal,vki,device);
  }
  return;
}

Assistant:

void ImageFetchRenderInstance::writeDescriptorSet (const vk::DeviceInterface&		vki,
												   vk::VkDevice						device,
												   vk::VkDescriptorType				descriptorType,
												   ShaderInputInterface				shaderInterface,
												   vk::VkDescriptorSetLayout		layout,
												   vk::VkDescriptorPool				pool,
												   vk::VkImageView					viewA,
												   vk::VkImageView					viewB,
												   vk::VkDescriptorSet				descriptorSet,
												   vk::DescriptorSetUpdateBuilder&	updateBuilder,
												   DescriptorUpdateMethod			updateMethod)
{
	DE_UNREF(layout);
	DE_UNREF(pool);
	const vk::VkImageLayout									imageLayout			= getImageLayoutForDescriptorType(descriptorType);
	const vk::VkDescriptorImageInfo							imageInfos[2]		=
	{
		makeDescriptorImageInfo(viewA, imageLayout),
		makeDescriptorImageInfo(viewB, imageLayout),
	};

	switch (shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
			updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(0u), descriptorType, &imageInfos[0]);
			break;

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
			updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(0u), descriptorType, &imageInfos[0]);
			updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(1u), descriptorType, &imageInfos[1]);
			break;

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			updateBuilder.writeArray(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(0u), descriptorType, 2u, imageInfos);
			break;

		default:
			DE_FATAL("Impossible");
	}

	if (updateMethod == DESCRIPTOR_UPDATE_METHOD_NORMAL)
	{
		updateBuilder.update(vki, device);
	}
}